

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# transaction_tests.cpp
# Opt level: O2

void __thiscall transaction_tests::tx_oversized::test_method(tx_oversized *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  bool bVar3;
  check_type cVar6;
  size_t in_RDX;
  size_t payloadSize;
  size_t payloadSize_00;
  iterator in_R8;
  iterator pvVar4;
  iterator in_R9;
  iterator pvVar5;
  long in_FS_OFFSET;
  const_string file;
  const_string file_00;
  const_string file_01;
  const_string msg;
  const_string msg_00;
  const_string msg_01;
  char *local_1d8;
  char *local_1d0;
  undefined1 *local_1c8;
  undefined1 *local_1c0;
  char *local_1b8;
  char *local_1b0;
  char *local_1a8;
  char *local_1a0;
  undefined1 *local_198;
  undefined1 *local_190;
  char *local_188;
  char *local_180;
  char *local_178;
  char *local_170;
  char *local_168;
  char *local_160;
  lazy_ostream local_158;
  undefined1 *local_148;
  char **local_140;
  assertion_result local_138;
  undefined1 *local_120;
  undefined1 *local_118;
  char *local_110;
  char *local_108;
  TxValidationState state;
  CTransaction local_b8;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  test_method::anon_class_1_0_00000001::operator()
            (&local_b8,(anon_class_1_0_00000001 *)0xf4240,in_RDX);
  state.super_ValidationState<TxValidationResult>._0_8_ = &::TX_NO_WITNESS;
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p =
       (pointer)&local_b8;
  _cVar6 = (check_type)
           GetSerializeSize<ParamsWrapper<TransactionSerParams,CTransaction>>
                     ((ParamsWrapper<TransactionSerParams,_CTransaction> *)&state);
  CTransaction::~CTransaction(&local_b8);
  paVar1 = &state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2;
  state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  paVar2 = &state.super_ValidationState<TxValidationResult>.m_debug_message.field_2;
  state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p = (pointer)paVar1
  ;
  state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p = (pointer)paVar2
  ;
  test_method::anon_class_1_0_00000001::operator()
            (&local_b8,(anon_class_1_0_00000001 *)(2000000 - (long)_cVar6),payloadSize);
  CheckTransaction(&local_b8,&state);
  CTransaction::~CTransaction(&local_b8);
  local_110 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_108 = "";
  local_120 = &boost::unit_test::basic_cstring<char_const>::null;
  local_118 = &boost::unit_test::basic_cstring<char_const>::null;
  file.m_end = (iterator)0x18e;
  file.m_begin = (iterator)&local_110;
  msg.m_end = in_R9;
  msg.m_begin = in_R8;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file,(size_t)&local_120,msg);
  std::__cxx11::string::string
            ((string *)&local_b8,&state.super_ValidationState<TxValidationResult>.m_reject_reason);
  bVar3 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          &local_b8,"bad-txns-oversize");
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_140 = &local_168;
  local_168 = "state.GetRejectReason() != \"bad-txns-oversize\"";
  local_160 = "";
  local_158.m_empty = false;
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_178 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_170 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = (iterator)0x0;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,&local_158,1,0,WARN,_cVar6,(size_t)&local_178,0x18e);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  std::__cxx11::string::~string((string *)&local_b8);
  ValidationState<TxValidationResult>::~ValidationState
            (&state.super_ValidationState<TxValidationResult>);
  state.super_ValidationState<TxValidationResult>.m_mode = M_VALID;
  state.super_ValidationState<TxValidationResult>.m_result = TX_RESULT_UNSET;
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_string_length = 0;
  state.super_ValidationState<TxValidationResult>.m_reject_reason.field_2._M_local_buf[0] = '\0';
  state.super_ValidationState<TxValidationResult>.m_debug_message._M_string_length = 0;
  state.super_ValidationState<TxValidationResult>.m_debug_message.field_2._M_local_buf[0] = '\0';
  local_188 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_180 = "";
  local_198 = &boost::unit_test::basic_cstring<char_const>::null;
  local_190 = &boost::unit_test::basic_cstring<char_const>::null;
  file_00.m_end = (iterator)0x194;
  file_00.m_begin = (iterator)&local_188;
  msg_00.m_end = pvVar5;
  msg_00.m_begin = pvVar4;
  state.super_ValidationState<TxValidationResult>.m_reject_reason._M_dataplus._M_p = (pointer)paVar1
  ;
  state.super_ValidationState<TxValidationResult>.m_debug_message._M_dataplus._M_p = (pointer)paVar2
  ;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_00,(size_t)&local_198,
             msg_00);
  test_method::anon_class_1_0_00000001::operator()
            (&local_b8,(anon_class_1_0_00000001 *)(0x1e8481 - (long)_cVar6),payloadSize_00);
  bVar3 = CheckTransaction(&local_b8,&state);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)!bVar3;
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_158.m_empty = false;
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_0114b750;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = (char **)0xc5426c;
  local_1a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_1a0 = "";
  pvVar4 = &DAT_00000001;
  pvVar5 = &DAT_00000001;
  boost::test_tools::tt_detail::report_assertion
            (&local_138,&local_158,1,1,WARN,_cVar6,(size_t)&local_1a8,0x194);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  CTransaction::~CTransaction(&local_b8);
  local_1b8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_1b0 = "";
  local_1c8 = &boost::unit_test::basic_cstring<char_const>::null;
  local_1c0 = &boost::unit_test::basic_cstring<char_const>::null;
  file_01.m_end = (iterator)0x195;
  file_01.m_begin = (iterator)&local_1b8;
  msg_01.m_end = pvVar5;
  msg_01.m_begin = pvVar4;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,file_01,(size_t)&local_1c8,
             msg_01);
  std::__cxx11::string::string
            ((string *)&local_b8,&state.super_ValidationState<TxValidationResult>.m_reject_reason);
  local_138.p_predicate_value.super_readonly_property<bool>.super_class_property<bool>.value =
       (readonly_property<bool>)
       std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       &local_b8,"bad-txns-oversize");
  local_138.m_message.px = (element_type *)0x0;
  local_138.m_message.pn.pi_ = (sp_counted_base *)0x0;
  local_168 = "state.GetRejectReason() == \"bad-txns-oversize\"";
  local_160 = "";
  local_158.m_empty = false;
  local_158._vptr_lazy_ostream = (_func_int **)&PTR__lazy_ostream_011481f0;
  local_148 = boost::unit_test::lazy_ostream::inst;
  local_140 = &local_168;
  local_1d8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/achow101[P]bitcoin/src/test/transaction_tests.cpp"
  ;
  local_1d0 = "";
  boost::test_tools::tt_detail::report_assertion
            (&local_138,&local_158,1,0,WARN,_cVar6,(size_t)&local_1d8,0x195);
  boost::detail::shared_count::~shared_count(&local_138.m_message.pn);
  std::__cxx11::string::~string((string *)&local_b8);
  ValidationState<TxValidationResult>::~ValidationState
            (&state.super_ValidationState<TxValidationResult>);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

BOOST_AUTO_TEST_CASE(tx_oversized)
{
    auto createTransaction =[](size_t payloadSize) {
        CMutableTransaction tx;
        tx.vin.resize(1);
        tx.vout.emplace_back(1, CScript() << OP_RETURN << std::vector<unsigned char>(payloadSize));
        return CTransaction(tx);
    };
    const auto maxTransactionSize = MAX_BLOCK_WEIGHT / WITNESS_SCALE_FACTOR;
    const auto oversizedTransactionBaseSize = ::GetSerializeSize(TX_NO_WITNESS(createTransaction(maxTransactionSize))) - maxTransactionSize;

    auto maxPayloadSize = maxTransactionSize - oversizedTransactionBaseSize;
    {
        TxValidationState state;
        CheckTransaction(createTransaction(maxPayloadSize), state);
        BOOST_CHECK(state.GetRejectReason() != "bad-txns-oversize");
    }

    maxPayloadSize += 1;
    {
        TxValidationState state;
        BOOST_CHECK_MESSAGE(!CheckTransaction(createTransaction(maxPayloadSize), state), "Oversized transaction should be invalid");
        BOOST_CHECK(state.GetRejectReason() == "bad-txns-oversize");
    }
}